

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

ON_Extrusion *
ON_Extrusion::Pipe(ON_Cylinder *cylinder,double other_radius,bool bCapBottom,bool bCapTop,
                  ON_Extrusion *extrusion)

{
  bool bVar1;
  uint uVar2;
  ON_ArcCurve *this;
  double dVar3;
  double local_1a0;
  double local_198;
  ON_Extrusion *extrusion_pipe;
  ON_ArcCurve *inner_profile;
  undefined1 local_160 [8];
  ON_Circle inner_circle;
  ON_Cylinder outer_cylinder;
  double outer_radius;
  double inner_radius;
  ON_Extrusion *extrusion_local;
  bool bCapTop_local;
  bool bCapBottom_local;
  double other_radius_local;
  ON_Cylinder *cylinder_local;
  
  bVar1 = ON_Cylinder::IsValid(cylinder);
  if (((!bVar1) || (bVar1 = ON_IsValid(other_radius), !bVar1)) ||
     (dVar3 = ON_Circle::Radius(&cylinder->circle),
     ABS(other_radius - dVar3) <= 2.3283064365386963e-10)) {
    cylinder_local = (ON_Cylinder *)0x0;
  }
  else {
    local_198 = other_radius;
    if ((cylinder->circle).radius <= other_radius) {
      local_198 = (cylinder->circle).radius;
    }
    local_1a0 = other_radius;
    if (other_radius < (cylinder->circle).radius) {
      local_1a0 = (cylinder->circle).radius;
    }
    bVar1 = ON_IsValid(local_198);
    if (((!bVar1) || (bVar1 = ON_IsValid(local_1a0), !bVar1)) ||
       (local_1a0 - local_198 <= 2.3283064365386963e-10)) {
      cylinder_local = (ON_Cylinder *)0x0;
    }
    else {
      memcpy(&inner_circle.radius,cylinder,0x98);
      ON_Circle::ON_Circle((ON_Circle *)local_160,&ON_Plane::World_xy,local_198);
      this = (ON_ArcCurve *)operator_new(0xc0);
      ON_ArcCurve::ON_ArcCurve(this,(ON_Circle *)local_160);
      this->m_dim = 2;
      uVar2 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0)
      ;
      if ((uVar2 & 1) == 0) {
        if (this != (ON_ArcCurve *)0x0) {
          (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
        }
        cylinder_local = (ON_Cylinder *)0x0;
      }
      else {
        cylinder_local =
             (ON_Cylinder *)
             Cylinder((ON_Cylinder *)&inner_circle.radius,bCapBottom,bCapTop,extrusion);
        if ((ON_Extrusion *)cylinder_local == (ON_Extrusion *)0x0) {
          if (this != (ON_ArcCurve *)0x0) {
            (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
          }
          cylinder_local = (ON_Cylinder *)0x0;
        }
        else {
          uVar2 = (*(((ON_Extrusion *)cylinder_local)->super_ON_Surface).super_ON_Geometry.
                    super_ON_Object._vptr_ON_Object[6])(cylinder_local,0);
          if ((uVar2 & 1) == 0) {
            if ((extrusion == (ON_Extrusion *)0x0) &&
               ((ON_Extrusion *)cylinder_local != (ON_Extrusion *)0x0)) {
              (*(((ON_Extrusion *)cylinder_local)->super_ON_Surface).super_ON_Geometry.
                super_ON_Object._vptr_ON_Object[4])();
            }
            if (this != (ON_ArcCurve *)0x0) {
              (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
            }
            cylinder_local = (ON_Cylinder *)0x0;
          }
          else {
            bVar1 = AddInnerProfile((ON_Extrusion *)cylinder_local,(ON_Curve *)this);
            if (bVar1) {
              uVar2 = (*(((ON_Extrusion *)cylinder_local)->super_ON_Surface).super_ON_Geometry.
                        super_ON_Object._vptr_ON_Object[6])(cylinder_local,0);
              if ((uVar2 & 1) == 0) {
                if ((extrusion == (ON_Extrusion *)0x0) &&
                   ((ON_Extrusion *)cylinder_local != (ON_Extrusion *)0x0)) {
                  (*(((ON_Extrusion *)cylinder_local)->super_ON_Surface).super_ON_Geometry.
                    super_ON_Object._vptr_ON_Object[4])();
                }
                cylinder_local = (ON_Cylinder *)0x0;
              }
            }
            else {
              if ((extrusion == (ON_Extrusion *)0x0) &&
                 ((ON_Extrusion *)cylinder_local != (ON_Extrusion *)0x0)) {
                (*(((ON_Extrusion *)cylinder_local)->super_ON_Surface).super_ON_Geometry.
                  super_ON_Object._vptr_ON_Object[4])();
              }
              if (this != (ON_ArcCurve *)0x0) {
                (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
              }
              cylinder_local = (ON_Cylinder *)0x0;
            }
          }
        }
      }
      ON_Circle::~ON_Circle((ON_Circle *)local_160);
      ON_Cylinder::~ON_Cylinder((ON_Cylinder *)&inner_circle.radius);
    }
  }
  return (ON_Extrusion *)cylinder_local;
}

Assistant:

ON_Extrusion* ON_Extrusion::Pipe( 
  const ON_Cylinder& cylinder, 
  double other_radius,
  bool bCapBottom,
  bool bCapTop,
  ON_Extrusion* extrusion
  )
{
  if (    !cylinder.IsValid() 
       || !ON_IsValid(other_radius)
       || !(fabs(other_radius - cylinder.circle.Radius()) > ON_ZERO_TOLERANCE)
       )
  {
    return 0;
  }

  double inner_radius = (other_radius < cylinder.circle.radius)
                      ? other_radius
                      : cylinder.circle.radius;
  double outer_radius = (other_radius < cylinder.circle.radius)
                      ? cylinder.circle.radius
                      : other_radius;
  if (    !ON_IsValid(inner_radius) 
       || !ON_IsValid(outer_radius)
       || !(outer_radius - inner_radius > ON_ZERO_TOLERANCE)
     )
  {
    return 0;
  }

  ON_Cylinder outer_cylinder = cylinder;
  outer_cylinder.circle.radius = outer_radius;

  ON_Circle inner_circle(ON_Plane::World_xy,inner_radius);
  ON_ArcCurve* inner_profile = new ON_ArcCurve(inner_circle);
  inner_profile->m_dim = 2;
  if ( !inner_profile->IsValid() )
  {
    delete inner_profile;
    return 0;
  }

  ON_Extrusion* extrusion_pipe = ON_Extrusion::Cylinder(outer_cylinder,bCapBottom,bCapTop,extrusion);
  if ( 0 == extrusion_pipe )
  {
    delete inner_profile;
    return 0;
  }

  if ( !extrusion_pipe->IsValid() )
  {
    if ( 0 == extrusion )
      delete extrusion_pipe;
    delete inner_profile;
    return 0;
  }

  if ( !extrusion_pipe->AddInnerProfile(inner_profile) )
  {
    if ( 0 == extrusion )
      delete extrusion_pipe;
    delete inner_profile;
    return 0;
  }

  if ( !extrusion_pipe->IsValid() )
  {
    if ( 0 == extrusion )
      delete extrusion_pipe;
    return 0;
  }

  return extrusion_pipe;
}